

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::calculateProblemRanges
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  undefined8 *puVar1;
  pointer pnVar2;
  type_conflict5 tVar3;
  double *pdVar4;
  bool *pbVar5;
  int *piVar6;
  bool *pbVar7;
  cpp_dec_float<50U,_int,_void> *pcVar8;
  int *piVar9;
  long lVar10;
  bool *extraout_RDX;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_01;
  bool *extraout_RDX_00;
  bool *pbVar11;
  long lVar12;
  ulong uVar13;
  int j;
  cpp_dec_float<50U,_int,_void> local_3c8;
  cpp_dec_float<50U,_int,_void> local_388;
  cpp_dec_float<50U,_int,_void> local_348;
  cpp_dec_float<50U,_int,_void> local_308;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  abslow;
  undefined1 local_288 [40];
  int local_260;
  bool local_25c [4];
  ulong local_258;
  cpp_dec_float<50U,_int,_void> local_248;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  absupp;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  absobj;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined4 local_170;
  undefined1 local_16c;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined4 local_130;
  undefined1 local_12c;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined4 local_f0;
  undefined1 local_ec;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined4 local_b0;
  undefined1 local_ac;
  undefined8 local_a8;
  cpp_dec_float<50U,_int,_void> local_a0;
  multiprecision local_68 [56];
  
  pdVar4 = (double *)infinity();
  _j = 0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_248,*pdVar4,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<50U,_int,_void> *)local_288,0.0,(type *)0x0);
  pdVar4 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_308,*pdVar4,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_348,0.0,(type *)0x0);
  pdVar4 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_388,*pdVar4,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_3c8,0.0,(type *)0x0);
  lVar12 = 0x30;
  pbVar7 = extraout_RDX;
  for (; _j < (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum; _j = _j + 1) {
    pnVar2 = (this->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .low.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_b8 = *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar12 + -0x10);
    puVar1 = (undefined8 *)((long)&(pnVar2->m_backend).data + lVar12 + -0x30);
    local_d8 = *puVar1;
    uStack_d0 = puVar1[1];
    puVar1 = (undefined8 *)((long)&(pnVar2->m_backend).data + lVar12 + -0x20);
    local_c8 = *puVar1;
    uStack_c0 = puVar1[1];
    local_b0 = *(undefined4 *)((long)&(pnVar2->m_backend).data + lVar12 + -8);
    local_ac = *(undefined1 *)((long)&(pnVar2->m_backend).data + lVar12 + -4);
    local_a8 = *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar12);
    boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&abslow,(multiprecision *)&local_d8,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)pbVar7);
    pnVar2 = (this->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .low.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_f8 = *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar12 + -0x10);
    puVar1 = (undefined8 *)((long)&(pnVar2->m_backend).data + lVar12 + -0x30);
    local_118 = *puVar1;
    uStack_110 = puVar1[1];
    puVar1 = (undefined8 *)((long)&(pnVar2->m_backend).data + lVar12 + -0x20);
    local_108 = *puVar1;
    uStack_100 = puVar1[1];
    local_f0 = *(undefined4 *)((long)&(pnVar2->m_backend).data + lVar12 + -8);
    local_ec = *(undefined1 *)((long)&(pnVar2->m_backend).data + lVar12 + -4);
    local_e8 = *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar12);
    boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&absupp,(multiprecision *)&local_118,arg);
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)local_68,
          &this->
           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ,(int)_j);
    boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&absobj,local_68,arg_00);
    pdVar4 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_a0,*pdVar4,(type *)0x0);
    tVar3 = boost::multiprecision::operator<
                      (&abslow,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_a0);
    if (tVar3) {
      tVar3 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_308,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&abslow.m_backend);
      pcVar8 = &abslow.m_backend;
      if (tVar3) {
        pcVar8 = &local_308;
      }
      local_308.data._M_elems._32_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 8);
      local_308.data._M_elems._16_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 4);
      local_308.data._M_elems._24_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 6);
      local_308.data._M_elems._0_8_ =
           *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems;
      local_308.data._M_elems._8_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 2);
      piVar9 = &abslow.m_backend.exp;
      piVar6 = piVar9;
      if (tVar3) {
        piVar6 = &local_308.exp;
      }
      local_308.exp = *piVar6;
      pbVar7 = &abslow.m_backend.neg;
      pbVar5 = pbVar7;
      if (tVar3) {
        pbVar5 = &local_308.neg;
      }
      local_308.neg = *pbVar5;
      uVar13 = CONCAT44((int)((uint)tVar3 << 0x1f) >> 0x1f,(int)((uint)tVar3 << 0x1f) >> 0x1f);
      local_308._48_8_ = ~uVar13 & abslow.m_backend._48_8_ | local_308._48_8_ & uVar13;
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_348,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&abslow.m_backend);
      pcVar8 = &abslow.m_backend;
      if (tVar3) {
        pcVar8 = &local_348;
      }
      local_348.data._M_elems._32_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 8);
      local_348.data._M_elems._16_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 4);
      local_348.data._M_elems._24_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 6);
      local_348.data._M_elems._0_8_ =
           *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems;
      local_348.data._M_elems._8_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 2);
      if (tVar3) {
        piVar9 = &local_348.exp;
      }
      local_348.exp = *piVar9;
      if (tVar3) {
        pbVar7 = &local_348.neg;
      }
      local_348.neg = *pbVar7;
      uVar13 = CONCAT44((int)((uint)tVar3 << 0x1f) >> 0x1f,(int)((uint)tVar3 << 0x1f) >> 0x1f);
      local_348._48_8_ = ~uVar13 & abslow.m_backend._48_8_ | local_348._48_8_ & uVar13;
    }
    pdVar4 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_a0,*pdVar4,(type *)0x0);
    tVar3 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&absupp.m_backend,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_a0);
    if (tVar3) {
      tVar3 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_308,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&absupp.m_backend);
      pcVar8 = &absupp.m_backend;
      if (tVar3) {
        pcVar8 = &local_308;
      }
      local_308.data._M_elems._32_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 8);
      local_308.data._M_elems._16_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 4);
      local_308.data._M_elems._24_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 6);
      local_308.data._M_elems._0_8_ =
           *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems;
      local_308.data._M_elems._8_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 2);
      piVar9 = &absupp.m_backend.exp;
      piVar6 = piVar9;
      if (tVar3) {
        piVar6 = &local_308.exp;
      }
      local_308.exp = *piVar6;
      pbVar7 = &absupp.m_backend.neg;
      pbVar5 = pbVar7;
      if (tVar3) {
        pbVar5 = &local_308.neg;
      }
      local_308.neg = *pbVar5;
      uVar13 = CONCAT44((int)((uint)tVar3 << 0x1f) >> 0x1f,(int)((uint)tVar3 << 0x1f) >> 0x1f);
      local_308._48_8_ = ~uVar13 & absupp.m_backend._48_8_ | local_308._48_8_ & uVar13;
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_348,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&absupp.m_backend);
      pcVar8 = &absupp.m_backend;
      if (tVar3) {
        pcVar8 = &local_348;
      }
      local_348.data._M_elems._32_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 8);
      local_348.data._M_elems._16_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 4);
      local_348.data._M_elems._24_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 6);
      local_348.data._M_elems._0_8_ =
           *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems;
      local_348.data._M_elems._8_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 2);
      if (tVar3) {
        piVar9 = &local_348.exp;
      }
      local_348.exp = *piVar9;
      if (tVar3) {
        pbVar7 = &local_348.neg;
      }
      local_348.neg = *pbVar7;
      uVar13 = CONCAT44((int)((uint)tVar3 << 0x1f) >> 0x1f,(int)((uint)tVar3 << 0x1f) >> 0x1f);
      local_348._48_8_ = ~uVar13 & absupp.m_backend._48_8_ | local_348._48_8_ & uVar13;
    }
    tVar3 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_248,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&absobj.m_backend);
    pcVar8 = &absobj.m_backend;
    if (tVar3) {
      pcVar8 = &local_248;
    }
    local_248.data._M_elems._32_8_ =
         *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 8);
    local_248.data._M_elems._16_8_ =
         *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 4);
    local_248.data._M_elems._24_8_ =
         *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 6);
    local_248.data._M_elems._0_8_ =
         *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems;
    local_248.data._M_elems._8_8_ =
         *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 2);
    pbVar5 = (bool *)&absobj.m_backend.exp;
    piVar9 = (int *)pbVar5;
    if (tVar3) {
      piVar9 = &local_248.exp;
    }
    local_248.exp = *piVar9;
    pbVar11 = &absobj.m_backend.neg;
    pbVar7 = pbVar11;
    if (tVar3) {
      pbVar7 = &local_248.neg;
    }
    local_248.neg = *pbVar7;
    uVar13 = CONCAT44((int)((uint)tVar3 << 0x1f) >> 0x1f,(int)((uint)tVar3 << 0x1f) >> 0x1f);
    local_248._48_8_ = ~uVar13 & absobj.m_backend._48_8_ | local_248._48_8_ & uVar13;
    tVar3 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_288,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&absobj.m_backend);
    pcVar8 = &absobj.m_backend;
    if (tVar3) {
      pcVar8 = (cpp_dec_float<50U,_int,_void> *)local_288;
    }
    local_288._32_8_ =
         *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 8);
    local_288._16_8_ =
         *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 4);
    local_288._24_8_ =
         *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 6);
    local_288._0_8_ =
         *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems;
    local_288._8_8_ =
         *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 2);
    pbVar7 = (bool *)&local_260;
    if (tVar3) {
      pbVar5 = pbVar7;
    }
    if (tVar3) {
      pbVar11 = local_25c;
    }
    local_260 = *(int *)pbVar5;
    local_25c[0] = *pbVar11;
    uVar13 = CONCAT44((int)((uint)tVar3 << 0x1f) >> 0x1f,(int)((uint)tVar3 << 0x1f) >> 0x1f);
    local_258 = ~uVar13 & absobj.m_backend._48_8_ | local_258 & uVar13;
    lVar12 = lVar12 + 0x38;
  }
  lVar12 = 0x30;
  lVar10 = 0;
  while( true ) {
    if ((this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.thenum <= lVar10) break;
    pnVar2 = (this->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .left.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_138 = *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar12 + -0x10);
    puVar1 = (undefined8 *)((long)&(pnVar2->m_backend).data + lVar12 + -0x30);
    local_158 = *puVar1;
    uStack_150 = puVar1[1];
    puVar1 = (undefined8 *)((long)&(pnVar2->m_backend).data + lVar12 + -0x20);
    local_148 = *puVar1;
    uStack_140 = puVar1[1];
    local_130 = *(undefined4 *)((long)&(pnVar2->m_backend).data + lVar12 + -8);
    local_12c = *(undefined1 *)((long)&(pnVar2->m_backend).data + lVar12 + -4);
    local_128 = *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar12);
    boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&abslow,(multiprecision *)&local_158,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)pbVar7);
    pnVar2 = (this->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .right.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_178 = *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar12 + -0x10);
    puVar1 = (undefined8 *)((long)&(pnVar2->m_backend).data + lVar12 + -0x30);
    local_198 = *puVar1;
    uStack_190 = puVar1[1];
    puVar1 = (undefined8 *)((long)&(pnVar2->m_backend).data + lVar12 + -0x20);
    local_188 = *puVar1;
    uStack_180 = puVar1[1];
    local_170 = *(undefined4 *)((long)&(pnVar2->m_backend).data + lVar12 + -8);
    local_16c = *(undefined1 *)((long)&(pnVar2->m_backend).data + lVar12 + -4);
    local_168 = *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar12);
    boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&absupp,(multiprecision *)&local_198,arg_01);
    pdVar4 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&absobj.m_backend,*pdVar4,(type *)0x0);
    tVar3 = boost::multiprecision::operator>
                      (&abslow,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&absobj.m_backend);
    if (tVar3) {
      tVar3 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_388,&abslow);
      pcVar8 = &abslow.m_backend;
      if (tVar3) {
        pcVar8 = &local_388;
      }
      local_388.data._M_elems._32_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 8);
      local_388.data._M_elems._16_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 4);
      local_388.data._M_elems._24_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 6);
      local_388.data._M_elems._0_8_ =
           *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems;
      local_388.data._M_elems._8_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 2);
      piVar9 = &abslow.m_backend.exp;
      piVar6 = piVar9;
      if (tVar3) {
        piVar6 = &local_388.exp;
      }
      local_388.exp = *piVar6;
      pbVar7 = &abslow.m_backend.neg;
      pbVar5 = pbVar7;
      if (tVar3) {
        pbVar5 = &local_388.neg;
      }
      local_388.neg = *pbVar5;
      uVar13 = CONCAT44((int)((uint)tVar3 << 0x1f) >> 0x1f,(int)((uint)tVar3 << 0x1f) >> 0x1f);
      local_388._48_8_ = ~uVar13 & abslow.m_backend._48_8_ | local_388._48_8_ & uVar13;
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_3c8,&abslow);
      pcVar8 = &abslow.m_backend;
      if (tVar3) {
        pcVar8 = &local_3c8;
      }
      local_3c8.data._M_elems._32_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 8);
      local_3c8.data._M_elems._16_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 4);
      local_3c8.data._M_elems._24_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 6);
      local_3c8.data._M_elems._0_8_ =
           *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems;
      local_3c8.data._M_elems._8_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 2);
      if (tVar3) {
        piVar9 = &local_3c8.exp;
      }
      local_3c8.exp = *piVar9;
      if (tVar3) {
        pbVar7 = &local_3c8.neg;
      }
      local_3c8.neg = *pbVar7;
      uVar13 = CONCAT44((int)((uint)tVar3 << 0x1f) >> 0x1f,(int)((uint)tVar3 << 0x1f) >> 0x1f);
      local_3c8._48_8_ = ~uVar13 & abslow.m_backend._48_8_ | local_3c8._48_8_ & uVar13;
    }
    pdVar4 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&absobj.m_backend,*pdVar4,(type *)0x0);
    tVar3 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&absupp.m_backend,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&absobj.m_backend);
    pbVar7 = extraout_RDX_00;
    if (tVar3) {
      tVar3 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_388,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&absupp.m_backend);
      pcVar8 = &absupp.m_backend;
      if (tVar3) {
        pcVar8 = &local_388;
      }
      local_388.data._M_elems._32_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 8);
      local_388.data._M_elems._16_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 4);
      local_388.data._M_elems._24_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 6);
      local_388.data._M_elems._0_8_ =
           *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems;
      local_388.data._M_elems._8_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 2);
      piVar9 = &absupp.m_backend.exp;
      piVar6 = piVar9;
      if (tVar3) {
        piVar6 = &local_388.exp;
      }
      local_388.exp = *piVar6;
      pbVar5 = &absupp.m_backend.neg;
      pbVar7 = pbVar5;
      if (tVar3) {
        pbVar7 = &local_388.neg;
      }
      local_388.neg = *pbVar7;
      uVar13 = CONCAT44((int)((uint)tVar3 << 0x1f) >> 0x1f,(int)((uint)tVar3 << 0x1f) >> 0x1f);
      local_388._48_8_ = ~uVar13 & absupp.m_backend._48_8_ | local_388._48_8_ & uVar13;
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_3c8,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&absupp.m_backend);
      pcVar8 = &absupp.m_backend;
      if (tVar3) {
        pcVar8 = &local_3c8;
      }
      local_3c8.data._M_elems._32_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 8);
      local_3c8.data._M_elems._16_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 4);
      local_3c8.data._M_elems._24_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 6);
      local_3c8.data._M_elems._0_8_ =
           *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems;
      local_3c8.data._M_elems._8_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar8->data)->data)._M_elems + 2);
      if (tVar3) {
        piVar9 = &local_3c8.exp;
      }
      local_3c8.exp = *piVar9;
      pbVar7 = &local_3c8.neg;
      if (tVar3) {
        pbVar5 = pbVar7;
      }
      local_3c8.neg = *pbVar5;
      uVar13 = CONCAT44((int)((uint)tVar3 << 0x1f) >> 0x1f,(int)((uint)tVar3 << 0x1f) >> 0x1f);
      local_3c8._48_8_ = ~uVar13 & absupp.m_backend._48_8_ | local_3c8._48_8_ & uVar13;
    }
    lVar10 = lVar10 + 1;
    lVar12 = lVar12 + 0x38;
  }
  abslow.m_backend.fpclass = cpp_dec_float_finite;
  abslow.m_backend.prec_elem = 10;
  abslow.m_backend.data._M_elems[0] = 0;
  abslow.m_backend.data._M_elems[1] = 0;
  abslow.m_backend.data._M_elems[2] = 0;
  abslow.m_backend.data._M_elems[3] = 0;
  abslow.m_backend.data._M_elems[4] = 0;
  abslow.m_backend.data._M_elems[5] = 0;
  abslow.m_backend.data._M_elems._24_5_ = 0;
  abslow.m_backend.data._M_elems[7]._1_3_ = 0;
  abslow.m_backend.data._M_elems._32_5_ = 0;
  abslow.m_backend.data._M_elems[9]._1_3_ = 0;
  abslow.m_backend.exp = 0;
  abslow.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&abslow.m_backend,&local_348,&local_308);
  *(ulong *)((this->boundrange).m_backend.data._M_elems + 8) =
       CONCAT35(abslow.m_backend.data._M_elems[9]._1_3_,abslow.m_backend.data._M_elems._32_5_);
  *(undefined8 *)((this->boundrange).m_backend.data._M_elems + 4) =
       abslow.m_backend.data._M_elems._16_8_;
  *(ulong *)((this->boundrange).m_backend.data._M_elems + 6) =
       CONCAT35(abslow.m_backend.data._M_elems[7]._1_3_,abslow.m_backend.data._M_elems._24_5_);
  *(undefined8 *)(this->boundrange).m_backend.data._M_elems = abslow.m_backend.data._M_elems._0_8_;
  *(undefined8 *)((this->boundrange).m_backend.data._M_elems + 2) =
       abslow.m_backend.data._M_elems._8_8_;
  (this->boundrange).m_backend.exp = abslow.m_backend.exp;
  (this->boundrange).m_backend.neg = abslow.m_backend.neg;
  (this->boundrange).m_backend.fpclass = abslow.m_backend.fpclass;
  (this->boundrange).m_backend.prec_elem = abslow.m_backend.prec_elem;
  abslow.m_backend.fpclass = cpp_dec_float_finite;
  abslow.m_backend.prec_elem = 10;
  abslow.m_backend.data._M_elems._0_16_ = ZEXT816(0);
  abslow.m_backend.data._M_elems[4] = 0;
  abslow.m_backend.data._M_elems[5] = 0;
  abslow.m_backend.data._M_elems._24_5_ = 0;
  abslow.m_backend.data._M_elems[7]._1_3_ = 0;
  abslow.m_backend.data._M_elems._32_5_ = 0;
  abslow.m_backend.data._M_elems[9]._1_3_ = 0;
  abslow.m_backend.exp = 0;
  abslow.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&abslow.m_backend,&local_3c8,&local_388);
  *(ulong *)((this->siderange).m_backend.data._M_elems + 8) =
       CONCAT35(abslow.m_backend.data._M_elems[9]._1_3_,abslow.m_backend.data._M_elems._32_5_);
  *(undefined8 *)((this->siderange).m_backend.data._M_elems + 4) =
       abslow.m_backend.data._M_elems._16_8_;
  *(ulong *)((this->siderange).m_backend.data._M_elems + 6) =
       CONCAT35(abslow.m_backend.data._M_elems[7]._1_3_,abslow.m_backend.data._M_elems._24_5_);
  *(undefined8 *)(this->siderange).m_backend.data._M_elems = abslow.m_backend.data._M_elems._0_8_;
  *(undefined8 *)((this->siderange).m_backend.data._M_elems + 2) =
       abslow.m_backend.data._M_elems._8_8_;
  (this->siderange).m_backend.exp = abslow.m_backend.exp;
  (this->siderange).m_backend.neg = abslow.m_backend.neg;
  (this->siderange).m_backend.fpclass = abslow.m_backend.fpclass;
  (this->siderange).m_backend.prec_elem = abslow.m_backend.prec_elem;
  abslow.m_backend.fpclass = cpp_dec_float_finite;
  abslow.m_backend.prec_elem = 10;
  abslow.m_backend.data._M_elems._0_16_ = ZEXT816(0);
  abslow.m_backend.data._M_elems[4] = 0;
  abslow.m_backend.data._M_elems[5] = 0;
  abslow.m_backend.data._M_elems._24_5_ = 0;
  abslow.m_backend.data._M_elems[7]._1_3_ = 0;
  abslow.m_backend.data._M_elems._32_5_ = 0;
  abslow.m_backend.data._M_elems[9]._1_3_ = 0;
  abslow.m_backend.exp = 0;
  abslow.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&abslow.m_backend,(cpp_dec_float<50U,_int,_void> *)local_288,&local_248);
  *(ulong *)((this->objrange).m_backend.data._M_elems + 8) =
       CONCAT35(abslow.m_backend.data._M_elems[9]._1_3_,abslow.m_backend.data._M_elems._32_5_);
  *(undefined8 *)((this->objrange).m_backend.data._M_elems + 4) =
       abslow.m_backend.data._M_elems._16_8_;
  *(ulong *)((this->objrange).m_backend.data._M_elems + 6) =
       CONCAT35(abslow.m_backend.data._M_elems[7]._1_3_,abslow.m_backend.data._M_elems._24_5_);
  *(undefined8 *)(this->objrange).m_backend.data._M_elems = abslow.m_backend.data._M_elems._0_8_;
  *(undefined8 *)((this->objrange).m_backend.data._M_elems + 2) =
       abslow.m_backend.data._M_elems._8_8_;
  (this->objrange).m_backend.exp = abslow.m_backend.exp;
  (this->objrange).m_backend.neg = abslow.m_backend.neg;
  (this->objrange).m_backend.fpclass = abslow.m_backend.fpclass;
  (this->objrange).m_backend.prec_elem = abslow.m_backend.prec_elem;
  return;
}

Assistant:

void SPxSolverBase<R>::calculateProblemRanges()
{
   // only collect absolute values
   R minobj = R(infinity);
   R maxobj = 0.0;
   R minbound = R(infinity);
   R maxbound = 0.0;
   R minside = R(infinity);
   R maxside = 0.0;

   // get min and max absolute values of bounds and objective
   for(int j = 0; j < this->nCols(); ++j)
   {
      R abslow = spxAbs(this->lower(j));
      R absupp = spxAbs(this->lower(j));
      R absobj = spxAbs(this->obj(j));

      if(abslow < R(infinity))
      {
         minbound = SOPLEX_MIN(minbound, abslow);
         maxbound = SOPLEX_MAX(maxbound, abslow);
      }

      if(absupp < R(infinity))
      {
         minbound = SOPLEX_MIN(minbound, absupp);
         maxbound = SOPLEX_MAX(maxbound, absupp);
      }

      minobj = SOPLEX_MIN(minobj, absobj);
      maxobj = SOPLEX_MAX(maxobj, absobj);
   }

   // get min and max absoute values of sides
   for(int i = 0; i < this->nRows(); ++i)
   {
      R abslhs = spxAbs(this->lhs(i));
      R absrhs = spxAbs(this->rhs(i));

      if(abslhs > R(infinity))
      {
         minside = SOPLEX_MIN(minside, abslhs);
         maxside = SOPLEX_MAX(maxside, abslhs);
      }

      if(absrhs < R(infinity))
      {
         minside = SOPLEX_MIN(minside, absrhs);
         maxside = SOPLEX_MAX(maxside, absrhs);
      }
   }

   boundrange = maxbound - minbound;
   siderange = maxside - minside;
   objrange = maxobj - minobj;
}